

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

bool dirichlet_check(int n,double *a)

{
  bool bVar1;
  ostream *poVar2;
  bool bVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar6 = 0;
  uVar5 = (ulong)(uint)n;
  if (n < 1) {
    uVar5 = uVar6;
  }
  bVar3 = false;
  do {
    if (uVar5 == uVar6) {
      bVar1 = true;
      if (!bVar3) {
        std::operator<<((ostream *)&std::cerr," \n");
        std::operator<<((ostream *)&std::cerr,"DIRICHLET_CHECK - Warning!\n");
        pcVar4 = "  All parameters are zero!\n";
        poVar2 = (ostream *)&std::cerr;
LAB_001998f3:
        std::operator<<(poVar2,pcVar4);
        bVar1 = false;
      }
      return bVar1;
    }
    if (a[uVar6] <= 0.0) {
      std::operator<<((ostream *)&std::cerr," \n");
      std::operator<<((ostream *)&std::cerr,"DIRICHLET_CHECK - Warning!\n");
      poVar2 = std::operator<<((ostream *)&std::cerr,"  A[");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)uVar6);
      std::operator<<(poVar2,"] <= 0.\n");
      poVar2 = std::operator<<((ostream *)&std::cerr,"  A[");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)uVar6);
      std::operator<<(poVar2,"] = ");
      poVar2 = std::ostream::_M_insert<double>(a[uVar6]);
      pcVar4 = ".\n";
      goto LAB_001998f3;
    }
    bVar3 = (bool)(bVar3 | 0.0 < a[uVar6]);
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

bool dirichlet_check ( int n, double a[] )

//****************************************************************************80
//
//  Purpose:
//
//    DIRICHLET_CHECK checks the parameters of the Dirichlet PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    30 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of components.
//
//    Input, double A[N], the probabilities for each component.
//    Each A[I] should be positive.
//
//    Output, bool DIRICHLET_CHECK, is true if the parameters are legal.
//
{
  int i;
  bool positive;

  positive = false;

  for ( i = 0; i < n; i++ )
  {
    if ( a[i] <= 0.0 )
    {
      cerr << " \n";
      cerr << "DIRICHLET_CHECK - Warning!\n";
      cerr << "  A[" << i << "] <= 0.\n";
      cerr << "  A[" << i << "] = " << a[i] << ".\n";
      return false;
    }
    else if ( 0.0 < a[i] )
    {
      positive = true;
    }
  }

  if ( !positive )
  {
    cerr << " \n";
    cerr << "DIRICHLET_CHECK - Warning!\n";
    cerr << "  All parameters are zero!\n";
    return false;
  }

  return true;
}